

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::unselectRow(QAccessibleTable *this,int row)

{
  char cVar1;
  SelectionMode SVar2;
  int iVar3;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar4;
  QItemSelectionModel *pQVar5;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QModelIndex local_c8;
  QArrayDataPointer<QItemSelectionRange> local_b0;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemView *)view(this);
  pQVar4 = QAbstractItemView::model(this_00);
  pQVar5 = QAbstractItemView::selectionModel(this_00);
  if (pQVar5 == (QItemSelectionModel *)0x0 || pQVar4 == (QAbstractItemModel *)0x0) {
    bVar7 = false;
    goto LAB_004da508;
  }
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex(&local_58,this_00);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QAbstractItemView *)view(this);
  pQVar6 = QAbstractItemView::model(this_01);
  (**(code **)(*(long *)pQVar6 + 0x60))(&local_78,pQVar6,row,0,&local_58);
  bVar7 = false;
  if (((local_78.r < 0) || (bVar7 = false, (long)local_78._0_8_ < 0)) ||
     (local_78.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_004da508;
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)&local_98,&local_78,&local_78);
  SVar2 = QAbstractItemView::selectionMode(this_00);
  if (SVar2 == ContiguousSelection) {
    iVar3 = (**(code **)(*(long *)this + 0x50))(this);
    if (iVar3 == 1) goto LAB_004da457;
    if (((row == 0) ||
        (cVar1 = QItemSelectionModel::isRowSelected((int)pQVar5,(QModelIndex *)(ulong)(row - 1)),
        cVar1 != '\0')) &&
       (cVar1 = QItemSelectionModel::isRowSelected((int)pQVar5,(QModelIndex *)(ulong)(row + 1)),
       cVar1 != '\0')) {
      iVar3 = (**(code **)(*(long *)this + 0x60))(this);
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_c8,pQVar4,iVar3 + -1,0,&local_58);
      QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_c8);
      QArrayDataPointer<QItemSelectionRange>::operator=(&local_98,&local_b0);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
    }
LAB_004da4e9:
    (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,&local_98,0x24);
    bVar7 = true;
  }
  else {
    if ((SVar2 != SingleSelection) ||
       (iVar3 = (**(code **)(*(long *)this + 0x50))(this), iVar3 != 1)) goto LAB_004da4e9;
LAB_004da457:
    bVar7 = false;
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
LAB_004da508:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QAccessibleTable::unselectRow(int row)
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = view()->model()->index(row, 0, rootIndex);
    if (!index.isValid())
        return false;

    QItemSelection selection(index, index);

    switch (theView->selectionMode()) {
    case QAbstractItemView::SingleSelection:
        //In SingleSelection and ContiguousSelection once an item
        //is selected, there's no way for the user to unselect all items
        if (selectedRowCount() == 1)
            return false;
        break;
    case QAbstractItemView::ContiguousSelection:
        if (selectedRowCount() == 1)
            return false;

        if ((!row || selectionModel->isRowSelected(row - 1, rootIndex))
            && selectionModel->isRowSelected(row + 1, rootIndex)) {
            //If there are rows selected both up the current row and down the current rown,
            //the ones which are down the current row will be deselected
            selection = QItemSelection(index, theModel->index(rowCount() - 1, 0, rootIndex));
        }
        break;
    default:
        break;
    }

    selectionModel->select(selection, QItemSelectionModel::Deselect | QItemSelectionModel::Rows);
    return true;
}